

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O0

void __thiscall ImplDispatchTest::SetUp(ImplDispatchTest *this)

{
  int iVar1;
  bool local_22;
  bool local_21;
  bool local_11;
  ImplDispatchTest *this_local;
  
  iVar1 = CRYPTO_is_AESNI_capable();
  this->aesni_ = iVar1 != 0;
  iVar1 = CRYPTO_is_AVX_capable();
  local_11 = false;
  if (iVar1 != 0) {
    iVar1 = CRYPTO_is_MOVBE_capable();
    local_11 = iVar1 != 0;
  }
  this->avx_movbe_ = local_11;
  iVar1 = CRYPTO_is_SSSE3_capable();
  this->ssse3_ = iVar1 != 0;
  iVar1 = CRYPTO_is_VAES_capable();
  local_21 = false;
  if (iVar1 != 0) {
    iVar1 = CRYPTO_is_VPCLMULQDQ_capable();
    local_21 = false;
    if (iVar1 != 0) {
      iVar1 = CRYPTO_is_AVX2_capable();
      local_21 = iVar1 != 0;
    }
  }
  this->vaes_ = local_21;
  iVar1 = CRYPTO_is_AVX512BW_capable();
  local_22 = false;
  if (iVar1 != 0) {
    iVar1 = CRYPTO_is_AVX512VL_capable();
    local_22 = false;
    if (iVar1 != 0) {
      iVar1 = CRYPTO_is_BMI2_capable();
      local_22 = iVar1 != 0;
    }
  }
  this->avx512_ = local_22;
  iVar1 = CRYPTO_cpu_avoid_zmm_registers();
  this->avoid_zmm_ = iVar1 != 0;
  this->is_x86_64_ = true;
  return;
}

Assistant:

void SetUp() override {
#if defined(OPENSSL_X86) || defined(OPENSSL_X86_64)
    aesni_ = CRYPTO_is_AESNI_capable();
    avx_movbe_ = CRYPTO_is_AVX_capable() && CRYPTO_is_MOVBE_capable();
    ssse3_ = CRYPTO_is_SSSE3_capable();
    vaes_ = CRYPTO_is_VAES_capable() && CRYPTO_is_VPCLMULQDQ_capable() &&
            CRYPTO_is_AVX2_capable();
    avx512_ = CRYPTO_is_AVX512BW_capable() && CRYPTO_is_AVX512VL_capable() &&
              CRYPTO_is_BMI2_capable();
    avoid_zmm_ = CRYPTO_cpu_avoid_zmm_registers();
    is_x86_64_ =
#if defined(OPENSSL_X86_64)
        true;
#else
        false;
#endif
#endif  // X86 || X86_64
  }